

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memstream.c
# Opt level: O0

ktx_error_code_e ktxMemStream_construct_ro(ktxStream *str,ktx_uint8_t *bytes,ktx_size_t numBytes)

{
  long in_RDX;
  long in_RSI;
  ktxStream *in_RDI;
  ktx_error_code_e result;
  ktxMem *mem;
  ktx_size_t in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  FILE *in_stack_ffffffffffffffd8;
  ktx_error_code_e local_4;
  
  if (((in_RDI == (ktxStream *)0x0) || (in_RSI == 0)) || (in_RDX == 0)) {
    local_4 = KTX_INVALID_VALUE;
  }
  else {
    local_4 = ktxMem_create_ro((ktxMem **)in_stack_ffffffffffffffd8,
                               (void *)(ulong)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (local_4 == KTX_SUCCESS) {
      (in_RDI->data).file = in_stack_ffffffffffffffd8;
      ktxMemStream_setup(in_RDI);
      in_RDI->closeOnDestruct = false;
    }
  }
  return local_4;
}

Assistant:

KTX_error_code ktxMemStream_construct_ro(ktxStream* str,
                                         const ktx_uint8_t* bytes,
                                         const ktx_size_t numBytes)
{
    ktxMem* mem;
    KTX_error_code result = KTX_SUCCESS;

    if (!str || !bytes || numBytes == 0)
        return KTX_INVALID_VALUE;

    result = ktxMem_create_ro(&mem, bytes, numBytes);

    if (KTX_SUCCESS == result) {
        str->data.mem = mem;
        ktxMemStream_setup(str);
        str->closeOnDestruct = KTX_FALSE;
    }

    return result;
}